

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_keyboard_test.cc
# Opt level: O3

int main(void)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  int iVar3;
  service *psVar4;
  io_service _io;
  virtual_keyboard_handler vkey;
  io_context local_530;
  string local_520;
  virtual_keyboard_handler local_500;
  
  boost::asio::io_context::io_context(&local_530);
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"ccel_vkey","");
  ccel::udev::virtual_keyboard_handler::virtual_keyboard_handler
            (&local_500,&local_530,&local_520,0x801);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  ccel::udev::virtual_keyboard_handler::set_click_time(&local_500,0xe9,0x14);
  iVar3 = 100;
  do {
    ccel::udev::virtual_keyboard_handler::click(&local_500,0xe9);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  ccel::udev::virtual_keyboard_handler::~virtual_keyboard_handler(&local_500);
  psVar4 = (local_530.super_execution_context.service_registry_)->first_service_;
  eVar2.service_registry_ = local_530.super_execution_context.service_registry_;
  if (psVar4 != (service *)0x0) {
    do {
      (*psVar4->_vptr_service[2])(psVar4);
      eVar2.service_registry_ = local_530.super_execution_context.service_registry_;
      psVar4 = psVar4->next_;
    } while (psVar4 != (service *)0x0);
    psVar4 = (local_530.super_execution_context.service_registry_)->first_service_;
    if (psVar4 != (service *)0x0) {
      do {
        ppp_Var1 = &psVar4->_vptr_service;
        psVar4 = psVar4->next_;
        (*(*ppp_Var1)[1])();
        (eVar2.service_registry_)->first_service_ = psVar4;
      } while (psVar4 != (service *)0x0);
      eVar2.service_registry_ = local_530.super_execution_context.service_registry_;
      if (local_530.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar2.service_registry_ = (service_registry *)0x0;
        goto LAB_00113c72;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar2.service_registry_)->mutex_);
LAB_00113c72:
  operator_delete(eVar2.service_registry_,0x40);
  return 0;
}

Assistant:

int main(){
  ccel::io_service _io;
  ccel::udev::virtual_keyboard_handler vkey(_io);
  vkey.set_click_time(233,20);
  for(auto i=0;i<100;i++){
  vkey.click(233);
  }
  return 0;

}